

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-handles.c
# Opt level: O2

void prepare_1_cb(uv_prepare_t *handle)

{
  int iVar1;
  undefined8 uVar2;
  char *__format;
  char *pcVar3;
  char *pcVar4;
  uv_prepare_t *puVar5;
  int64_t eval_b;
  int64_t eval_a;
  
  fputs("PREPARE_1_CB\n",_stderr);
  fflush(_stderr);
  if (handle != &prepare_1_handle) {
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar3 = "handle";
    uVar2 = 0x10b;
    puVar5 = &prepare_1_handle;
    pcVar4 = "&prepare_1_handle";
LAB_00157ec2:
    fprintf(_stderr,__format,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
            ,uVar2,pcVar3,"==",pcVar4,handle,"==",puVar5);
    abort();
  }
  if ((loop_iteration & 1U) == 0) {
    iVar1 = uv_prepare_start(&prepare_2_handle,prepare_2_cb);
    handle = (uv_prepare_t *)(long)iVar1;
    if (handle != (uv_prepare_t *)0x0) {
      __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
      pcVar3 = "r";
      uVar2 = 0x10f;
      puVar5 = (uv_prepare_t *)0x0;
      pcVar4 = "0";
      goto LAB_00157ec2;
    }
  }
  prepare_1_cb_called = prepare_1_cb_called + 1;
  loop_iteration = loop_iteration + 1;
  printf("Loop iteration %d of %d.\n",(ulong)(uint)loop_iteration,0x15);
  return;
}

Assistant:

static void prepare_1_cb(uv_prepare_t* handle) {
  int r;

  fprintf(stderr, "%s", "PREPARE_1_CB\n");
  fflush(stderr);
  ASSERT_PTR_EQ(handle, &prepare_1_handle);

  if (loop_iteration % 2 == 0) {
    r = uv_prepare_start(&prepare_2_handle, prepare_2_cb);
    ASSERT_OK(r);
  }

  prepare_1_cb_called++;
  loop_iteration++;

  printf("Loop iteration %d of %d.\n", loop_iteration, ITERATIONS);
}